

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_> __thiscall
nestl::impl::
make_shared_a_nothrow<nestl::impl::set<void*,std::less<void*>,nestl::allocator<void*>>,nestl::has_exceptions::exception_ptr_error,nestl::allocator<nestl::impl::set<void*,std::less<void*>,nestl::allocator<void*>>>>
          (impl *this,exception_ptr_error *err,
          allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>
          *param_2)

{
  bool bVar1;
  pointer ptr_00;
  set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_> *ptr_01;
  shared_count_base *extraout_RDX;
  shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_> sVar2;
  undefined1 local_50 [8];
  deallocation_scoped_guard<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_*,_nestl::allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>_>
  deallocationGuard;
  shared_count_t *ptr;
  allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_> *paStack_20;
  SharedCountAllocator sharedCountAlloc;
  allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_> *param_1_local;
  exception_ptr_error *err_local;
  
  paStack_20 = param_2;
  allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>
  ::allocator((allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>
               *)((long)&ptr + 7));
  ptr_00 = allocator_traits<nestl::allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>_>
           ::allocate<nestl::has_exceptions::exception_ptr_error>
                     (err,(allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>
                           *)((long)&ptr + 7),1,(void *)0x0);
  bVar1 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
  if (bVar1) {
    shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>::shared_ptr
              ((shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>
                *)this,(nullptr_t)0x0);
    deallocationGuard.m_size._4_4_ = 1;
  }
  else {
    nestl::detail::
    deallocation_scoped_guard<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_*,_nestl::allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>_>
    ::deallocation_scoped_guard
              ((deallocation_scoped_guard<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_*,_nestl::allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>_>
                *)local_50,
               (allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>
                *)((long)&ptr + 7),ptr_00,1);
    class_operations::
    construct<nestl::impl::type_stored_by_value<nestl::impl::set<void*,std::less<void*>,nestl::allocator<void*>>,nestl::allocator<nestl::impl::set<void*,std::less<void*>,nestl::allocator<void*>>>>,nestl::has_exceptions::exception_ptr_error,nestl::allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void*,std::less<void*>,nestl::allocator<void*>>,nestl::allocator<nestl::impl::set<void*,std::less<void*>,nestl::allocator<void*>>>>>&>
              (err,ptr_00,
               (allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>
                *)((long)&ptr + 7));
    bVar1 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
    if (bVar1) {
      shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>::
      shared_ptr((shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>
                  *)this,(nullptr_t)0x0);
    }
    else {
      type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>
      ::initialize<nestl::has_exceptions::exception_ptr_error>(ptr_00,err);
      bVar1 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
      if (bVar1) {
        shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>::
        shared_ptr((shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>
                    *)this,(nullptr_t)0x0);
      }
      else {
        nestl::detail::
        deallocation_scoped_guard<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_*,_nestl::allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>_>
        ::release((deallocation_scoped_guard<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_*,_nestl::allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>_>
                   *)local_50);
        ptr_01 = type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>
                 ::get(ptr_00);
        shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>::
        shared_ptr((shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>
                    *)this,ptr_01,&ptr_00->super_shared_count_base);
      }
    }
    deallocationGuard.m_size._4_4_ = 1;
    nestl::detail::
    deallocation_scoped_guard<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_*,_nestl::allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>_>
    ::~deallocation_scoped_guard
              ((deallocation_scoped_guard<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_*,_nestl::allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>_>
                *)local_50);
  }
  allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>
  ::~allocator((allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>
                *)((long)&ptr + 7));
  sVar2.m_refcount = extraout_RDX;
  sVar2.m_ptr = (element_type *)this;
  return sVar2;
}

Assistant:

shared_ptr<T> make_shared_a_nothrow(OperationError& err, Allocator& /* alloc */, Args&& ... args)
{
    static_assert(sizeof(T), "T must be complete type");
    typedef type_stored_by_value<T, Allocator> shared_count_t;
    typedef typename shared_count_t::allocator_type SharedCountAllocator;
    SharedCountAllocator sharedCountAlloc;

    shared_count_t* ptr = allocator_traits<SharedCountAllocator>::allocate(err, sharedCountAlloc, 1);
    if (err)
    {
        return {nullptr};
    }
    nestl::detail::deallocation_scoped_guard<shared_count_t*, SharedCountAllocator> deallocationGuard(sharedCountAlloc, ptr, 1);

    nestl::class_operations::construct(err, ptr, sharedCountAlloc);
    if (err)
    {
        return {nullptr};
    }

    ptr->initialize(err, std::forward<Args>(args) ...);
    if (err)
    {
        return {nullptr};
    }

    deallocationGuard.release();
    return shared_ptr<T>(ptr->get(), ptr);
}